

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O2

uint __thiscall Gluco::Solver::computeLBD(Solver *this,vec<Gluco::Lit> *lits,int end)

{
  Lit *pLVar1;
  VarData *pVVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int i_1;
  uint uVar7;
  int i;
  long lVar8;
  
  this->MYFLAG = this->MYFLAG + 1;
  if (this->incremental == 0) {
    pLVar1 = lits->data;
    pVVar2 = (this->vardata).data;
    puVar3 = (this->permDiff).data;
    uVar4 = 0;
    for (lVar8 = 0; lVar8 < lits->sz; lVar8 = lVar8 + 1) {
      iVar6 = pVVar2[pLVar1[lVar8].x >> 1].level;
      if (puVar3[iVar6] != this->MYFLAG) {
        puVar3[iVar6] = this->MYFLAG;
        uVar4 = uVar4 + 1;
      }
    }
  }
  else {
    uVar7 = lits->sz;
    if (end == -1) {
      end = uVar7;
    }
    pLVar1 = lits->data;
    pVVar2 = (this->vardata).data;
    puVar3 = (this->permDiff).data;
    lVar8 = 0;
    uVar5 = 0;
    uVar4 = 0;
    while ((lVar8 < (int)uVar7 && (uVar5 < (uint)end))) {
      iVar6 = pLVar1[lVar8].x >> 1;
      if ((this->incremental == 0) || (iVar6 <= this->nbVarsInitialFormula)) {
        uVar5 = uVar5 + 1;
        iVar6 = pVVar2[iVar6].level;
        if (puVar3[iVar6] != this->MYFLAG) {
          puVar3[iVar6] = this->MYFLAG;
          uVar4 = uVar4 + 1;
          uVar7 = lits->sz;
        }
      }
      lVar8 = lVar8 + 1;
    }
  }
  return uVar4;
}

Assistant:

inline unsigned int Solver::computeLBD(const vec<Lit> & lits,int end) {
  int nblevels = 0;
  MYFLAG++;

  if(incremental) { // ----------------- INCREMENTAL MODE
    if(end==-1) end = lits.size();
    unsigned int nbDone = 0;
    for(int i=0;i<lits.size();i++) {
      if(nbDone>=end) break;
      if(isSelector(var(lits[i]))) continue;
      nbDone++;
      int l = level(var(lits[i]));
      if (permDiff[l] != MYFLAG) {
        permDiff[l] = MYFLAG;
        nblevels++;
      }
    }
  } else { // -------- DEFAULT MODE. NOT A LOT OF DIFFERENCES... BUT EASIER TO READ
    for(int i=0;i<lits.size();i++) {
      int l = level(var(lits[i]));
      if (permDiff[l] != MYFLAG) {
        permDiff[l] = MYFLAG;
        nblevels++;
      }
    }
  }

  return nblevels;
}